

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O3

char * zt_cstr_map(char *s,ssize_t i,ssize_t j,char *from,char *to)

{
  byte bVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uchar map [256];
  char acStack_128 [256];
  
  memcpy(acStack_128,&DAT_00106220,0x100);
  if ((to != (char *)0x0 && from != (char *)0x0) && (bVar1 = *from, bVar1 != 0)) {
    lVar5 = 0;
    do {
      if (to[lVar5] == '\0') break;
      acStack_128[bVar1] = to[lVar5];
      bVar1 = from[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (bVar1 != 0);
  }
  if (s == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    sVar2 = strlen(s);
    if (sVar2 == 0) {
      lVar5 = 0;
      lVar7 = 0;
    }
    else {
      lVar6 = (i >> 0x3f & sVar2) + i;
      if ((long)sVar2 <= lVar6) {
        lVar6 = sVar2 - 1;
      }
      lVar7 = (j >> 0x3f & sVar2) + j;
      if ((long)sVar2 <= lVar7) {
        lVar7 = sVar2 - 1;
      }
      lVar5 = lVar7;
      if (lVar7 < lVar6) {
        lVar5 = lVar6;
      }
      if (lVar6 < lVar7) {
        lVar7 = lVar6;
      }
    }
    lVar3 = lVar7 - lVar5;
    lVar6 = -lVar3;
    if (0 < lVar3) {
      lVar6 = lVar3;
    }
    pcVar4 = (char *)zt_malloc_p(lVar6 + 2);
    lVar6 = 0;
    do {
      pcVar4[lVar6] = acStack_128[(byte)s[lVar6 + lVar7]];
      lVar6 = lVar6 + 1;
    } while ((lVar5 - lVar7) + 1 != lVar6);
    pcVar4[lVar6] = '\0';
  }
  return pcVar4;
}

Assistant:

char *
zt_cstr_map(const char *s, ssize_t i, ssize_t j,
            const char *from, const char *to) {
    unsigned char map[256] = { 0,   1,   2,   3,   4,   5,   6,   7,   8,   9,
                               10,  11,  12,  13,  14,  15,  16,  17,  18,  19,
                               20,  21,  22,  23,  24,  25,  26,  27,  28,  29,
                               30,  31,  32,  33,  34,  35,  36,  37,  38,  39,
                               40,  41,  42,  43,  44,  45,  46,  47,  48,  49,
                               50,  51,  52,  53,  54,  55,  56,  57,  58,  59,
                               60,  61,  62,  63,  64,  65,  66,  67,  68,  69,
                               70,  71,  72,  73,  74,  75,  76,  77,  78,  79,
                               80,  81,  82,  83,  84,  85,  86,  87,  88,  89,
                               90,  91,  92,  93,  94,  95,  96,  97,  98,  99,
                               100, 101, 102, 103, 104, 105, 106, 107, 108, 109,
                               110, 111, 112, 113, 114, 115, 116, 117, 118, 119,
                               120, 121, 122, 123, 124, 125, 126, 127, 128, 129,
                               130, 131, 132, 133, 134, 135, 136, 137, 138, 139,
                               140, 141, 142, 143, 144, 145, 146, 147, 148, 149,
                               150, 151, 152, 153, 154, 155, 156, 157, 158, 159,
                               160, 161, 162, 163, 164, 165, 166, 167, 168, 169,
                               170, 171, 172, 173, 174, 175, 176, 177, 178, 179,
                               180, 181, 182, 183, 184, 185, 186, 187, 188, 189,
                               190, 191, 192, 193, 194, 195, 196, 197, 198, 199,
                               200, 201, 202, 203, 204, 205, 206, 207, 208, 209,
                               210, 211, 212, 213, 214, 215, 216, 217, 218, 219,
                               220, 221, 222, 223, 224, 225 };

    if (from && to) {
        while (*from && *to) {
            map[(unsigned char)*from++] = *to++;
        }

        zt_assert(*from == 0 && *to == 0);
    }

    if (s) {
        char * new;
        char * p;

        CONVERT(s, i, j);
        p  = new = zt_malloc(char, IDXLEN(i, j) + 1);
        while (i <= j) {
            *p++ = map[(unsigned char)s[i++]];
        }
        *p = '\0';
        return new;
    }

    return NULL;
}